

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O2

int raviopen_jit(lua_State *L)

{
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0xd);
  luaL_setfuncs(L,ravilib,0);
  ravi_pushcfastcall(L,(void *)0x0,1);
  lua_setfield(L,-2,"exp");
  ravi_pushcfastcall(L,(void *)0x0,2);
  lua_setfield(L,-2,"ln");
  return 1;
}

Assistant:

int raviopen_jit(lua_State *L) {
  luaL_newlib(L, ravilib);
  /* faster calls some maths functions */
  ravi_pushcfastcall(L, NULL, RAVI_TFCF_EXP);
  lua_setfield(L, -2, "exp");
  ravi_pushcfastcall(L, NULL, RAVI_TFCF_LOG);
  lua_setfield(L, -2, "ln");
  return 1;
}